

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::flush(LogFile *this)

{
  MutexLock *in_RDI;
  MutexLockGuard lock;
  unique_ptr<MutexLock,_std::default_delete<MutexLock>_> *in_stack_ffffffffffffffe0;
  
  std::unique_ptr<MutexLock,_std::default_delete<MutexLock>_>::operator*(in_stack_ffffffffffffffe0);
  MutexLockGuard::MutexLockGuard((MutexLockGuard *)in_stack_ffffffffffffffe0,in_RDI);
  std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::operator->
            ((unique_ptr<AppendFile,_std::default_delete<AppendFile>_> *)0x10cb05);
  AppendFile::flush((AppendFile *)0x10cb0d);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x10cb19);
  return;
}

Assistant:

void LogFile::flush(){
    MutexLockGuard lock(*mutex_);
    file_->flush();
}